

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O2

void Abc_NodeMffcConeSupp_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,Vec_Ptr_t *vSupp,int fTopmost)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    if ((fTopmost == 0) &&
       (((uVar2 = *(uint *)&pNode->field_0x14 & 0xf, uVar2 == 2 || (uVar2 == 5)) ||
        (0 < (pNode->vFanouts).nSize)))) {
      vCone = vSupp;
      if (vSupp != (Vec_Ptr_t *)0x0) {
LAB_001e5a59:
        Vec_PtrPush(vCone,pNode);
        return;
      }
    }
    else {
      for (lVar3 = 0; lVar3 < (pNode->vFanins).nSize; lVar3 = lVar3 + 1) {
        Abc_NodeMffcConeSupp_rec
                  ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar3]],vCone,
                   vSupp,0);
      }
      if (vCone != (Vec_Ptr_t *)0x0) goto LAB_001e5a59;
    }
  }
  return;
}

Assistant:

void Abc_NodeMffcConeSupp_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, Vec_Ptr_t * vSupp, int fTopmost )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pNode) )
        return;
    Abc_NodeSetTravIdCurrent(pNode);
    // add to the new support nodes
    if ( !fTopmost && (Abc_ObjIsCi(pNode) || pNode->vFanouts.nSize > 0) )
    {
        if ( vSupp ) Vec_PtrPush( vSupp, pNode );
        return;
    }
    // recur on the children
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_NodeMffcConeSupp_rec( pFanin, vCone, vSupp, 0 );
    // collect the internal node
    if ( vCone ) Vec_PtrPush( vCone, pNode );
//    printf( "%d ", pNode->Id );
}